

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedResult.cpp
# Opt level: O2

void __thiscall oout::FmtNamed::~FmtNamed(FmtNamed *this)

{
  std::__cxx11::string::~string((string *)&this->name);
  operator_delete(this,0x30);
  return;
}

Assistant:

FmtNamed(const Format *format, const string &name)
		: format(format), name(name)
	{
	}